

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightstobin.cpp
# Opt level: O2

void doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  VulnerabilityWeight vw;
  char line [4096];
  
  fgets(line,0x1000,_stdin);
  uVar3 = 2;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%d,%f",&vw,&vw.vulnerability_id,&vw.weight);
    if (iVar1 != 3) break;
    fwrite(&vw,0xc,1,_stdout);
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,line);
  exit(1);
}

Assistant:

void doit() {

  char line[4096];
  fgets(line, sizeof(line), stdin);   // skip header
  int lineno = 2;
  VulnerabilityWeight vw;

  while (fgets(line, sizeof(line), stdin) != 0) {

    if (sscanf(line, "%d,%d,%f", &vw.areaperil_id, &vw.vulnerability_id,
				 &vw.weight) != 3) {
      fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
      exit(EXIT_FAILURE);
    }

    fwrite(&vw, sizeof(vw), 1, stdout);
    lineno++;

  }

}